

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPSocket.cpp
# Opt level: O0

void __thiscall hwnet::TCPSocket::OnActive(TCPSocket *this,int event)

{
  Poller *pPVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int *piVar7;
  enable_shared_from_this<hwnet::TCPSocket> local_70;
  shared_ptr<hwnet::Task> local_60;
  socklen_t local_4c;
  int local_48;
  socklen_t optlen;
  int optval;
  enable_shared_from_this<hwnet::TCPSocket> local_38;
  shared_ptr<hwnet::Channel> local_28;
  byte local_15;
  uint local_14;
  bool post;
  TCPSocket *pTStack_10;
  int event_local;
  TCPSocket *this_local;
  
  local_15 = 0;
  local_14 = event;
  pTStack_10 = this;
  uVar3 = Poller::WriteFlag();
  if ((event & uVar3) != 0) {
    pPVar1 = this->poller_;
    std::enable_shared_from_this<hwnet::TCPSocket>::shared_from_this(&local_38);
    std::shared_ptr<hwnet::Channel>::shared_ptr<hwnet::TCPSocket,void>
              (&local_28,(shared_ptr<hwnet::TCPSocket> *)&local_38);
    Poller::Disable(pPVar1,&local_28,4);
    std::shared_ptr<hwnet::Channel>::~shared_ptr(&local_28);
    std::shared_ptr<hwnet::TCPSocket>::~shared_ptr((shared_ptr<hwnet::TCPSocket> *)&local_38);
  }
  std::mutex::lock(&this->mtx);
  uVar3 = local_14;
  uVar4 = Poller::ReadFlag();
  uVar5 = local_14;
  if ((uVar3 & uVar4) != 0) {
    this->readableVer = this->readableVer + 1;
    this->readable = true;
  }
  uVar4 = Poller::WriteFlag();
  uVar3 = local_14;
  if ((uVar5 & uVar4) != 0) {
    this->writeableVer = this->writeableVer + 1;
    this->writeable = true;
  }
  uVar5 = Poller::ErrorFlag();
  if ((uVar3 & uVar5) != 0) {
    local_4c = 4;
    iVar6 = getsockopt(this->fd,1,4,&local_48,&local_4c);
    if (iVar6 < 0) {
      piVar7 = __errno_location();
      this->err = *piVar7;
    }
    else {
      this->err = local_48;
    }
    this->socketError = true;
  }
  bVar2 = canRead(this);
  if (((bVar2) || (bVar2 = canWrite(this), bVar2)) && ((this->doing & 1U) == 0)) {
    this->doing = true;
    local_15 = 1;
  }
  std::mutex::unlock(&this->mtx);
  if ((local_15 & 1) != 0) {
    pPVar1 = this->poller_;
    std::enable_shared_from_this<hwnet::TCPSocket>::shared_from_this(&local_70);
    std::shared_ptr<hwnet::Task>::shared_ptr<hwnet::TCPSocket,void>
              (&local_60,(shared_ptr<hwnet::TCPSocket> *)&local_70);
    Poller::PostTask(pPVar1,&local_60,this->pool_);
    std::shared_ptr<hwnet::Task>::~shared_ptr(&local_60);
    std::shared_ptr<hwnet::TCPSocket>::~shared_ptr((shared_ptr<hwnet::TCPSocket> *)&local_70);
  }
  return;
}

Assistant:

void TCPSocket::OnActive(int event) {
	auto post = false;

	if(event & Poller::WriteFlag()){
		this->poller_->Disable(shared_from_this(),Poller::Write);
	}

	this->mtx.lock();
	if(event & Poller::ReadFlag()) {
		++this->readableVer;
		this->readable = true;
	}

	if(event & Poller::WriteFlag()){
		++this->writeableVer;
		this->writeable = true;
	}

	if(event & Poller::ErrorFlag()) {
  		int optval;
  		socklen_t optlen = static_cast<socklen_t>(sizeof optval);
  		if (::getsockopt(this->fd, SOL_SOCKET, SO_ERROR, &optval, &optlen) < 0) {
    		err = errno;
  		} else {
  			err = optval;
  		}
		this->socketError = true;
	}

	if((canRead() || canWrite()) && !doing) {
		this->doing = true;
		post = true;
	}
	this->mtx.unlock();

	if(post) {
		poller_->PostTask(shared_from_this(),this->pool_);
	}
}